

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Alias::compile
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Alias *this)

{
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  *pMVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  Impl *pIVar5;
  Node *resolver;
  uint64_t scopeId;
  ErrorReporter *errorReporter;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Reader expression;
  Builder brandBuilder;
  SegmentBuilder *pSVar11;
  undefined8 *ptr;
  Arena *this_00;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_f8;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  StructBuilder local_58;
  
  if (this->initialized == false) {
    this->initialized = true;
    pIVar5 = this->module->compiler;
    _::OrphanBuilder::initStruct
              ((OrphanBuilder *)&local_f8,(pIVar5->workspace).orphanage.arena,
               (pIVar5->workspace).orphanage.capTable,(StructSize)0x10000);
    uVar7 = local_f8.ptr.field_1._16_8_;
    uVar6 = local_f8.ptr.field_1._8_8_;
    pSVar11 = (SegmentBuilder *)CONCAT44(local_f8.ptr.field_1._4_4_,local_f8.ptr.field_1.value.tag);
    if ((this->brandOrphan).builder.segment != (SegmentBuilder *)0x0) {
      _::OrphanBuilder::euthanize(&(this->brandOrphan).builder);
    }
    (this->brandOrphan).builder.segment = pSVar11;
    (this->brandOrphan).builder.capTable = (CapTableBuilder *)uVar6;
    (this->brandOrphan).builder.location = (word *)uVar7;
    (this->brandOrphan).builder.tag.content = local_f8.ptr._0_8_;
    this_00 = &(pIVar5->workspace).arena;
    local_f8.ptr.field_1.value.tag = local_f8.ptr.field_1.value.tag & 0xffffff00;
    local_f8.ptr._0_8_ = this;
    ptr = (undefined8 *)kj::Arena::allocateBytes(this_00,0x10,8,true);
    *ptr = this;
    *(undefined1 *)(ptr + 1) = 0;
    local_f8.ptr.field_1.value.tag._0_1_ = 1;
    kj::Arena::setDestructor
              (this_00,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Alias::compile()::__0>>);
    resolver = this->parent;
    scopeId = resolver->id;
    uVar4 = resolver->genericParamCount;
    errorReporter = &this->module->parserModule->super_ErrorReporter;
    local_68._0_4_ = (this->targetName)._reader.dataSize;
    local_68._4_2_ = (this->targetName)._reader.pointerCount;
    local_68._6_2_ = *(undefined2 *)&(this->targetName)._reader.field_0x26;
    uStack_60 = *(undefined8 *)&(this->targetName)._reader.nestingLimit;
    local_78 = (this->targetName)._reader.data;
    pWStack_70 = (this->targetName)._reader.pointers;
    local_88 = (this->targetName)._reader.segment;
    pCStack_80 = (this->targetName)._reader.capTable;
    _::OrphanBuilder::asStruct(&local_58,&(this->brandOrphan).builder,(StructSize)0x10000);
    expression._reader.capTable = pCStack_80;
    expression._reader.segment = local_88;
    expression._reader.data = local_78;
    expression._reader.pointers = pWStack_70;
    expression._reader.dataSize = (undefined4)local_68;
    expression._reader.pointerCount = local_68._4_2_;
    expression._reader._38_2_ = local_68._6_2_;
    expression._reader._40_8_ = uStack_60;
    brandBuilder._builder.capTable = local_58.capTable;
    brandBuilder._builder.segment = local_58.segment;
    brandBuilder._builder.data = local_58.data;
    brandBuilder._builder.pointers = local_58.pointers;
    brandBuilder._builder.dataSize = local_58.dataSize;
    brandBuilder._builder.pointerCount = local_58.pointerCount;
    brandBuilder._builder._38_2_ = local_58._38_2_;
    NodeTranslator::compileDecl
              (&local_f8,scopeId,uVar4,&resolver->super_Resolver,errorReporter,expression,
               brandBuilder);
    pMVar1 = &this->target;
    if (&local_f8 != pMVar1) {
      if ((pMVar1->ptr).isSet == true) {
        (this->target).ptr.isSet = false;
        if ((this->target).ptr.field_1.value.tag == 1) {
          (this->target).ptr.field_1.value.tag = 0;
        }
        if ((this->target).ptr.field_1.value.tag == 2) {
          (this->target).ptr.field_1.value.tag = 0;
        }
      }
      if (local_f8.ptr.isSet == true) {
        (this->target).ptr.field_1.value.tag = local_f8.ptr.field_1.value.tag;
        if (local_f8.ptr.field_1.value.tag == 2) {
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 8) = local_f8.ptr.field_1._8_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10) = local_f8.ptr.field_1._16_8_;
        }
        else if (local_f8.ptr.field_1.value.tag == 1) {
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x28) = local_f8.ptr.field_1._40_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x18) = local_f8.ptr.field_1._24_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x20) = local_f8.ptr.field_1._32_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 8) = local_f8.ptr.field_1._8_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10) = local_f8.ptr.field_1._16_8_;
          *(undefined1 *)((long)&(this->target).ptr.field_1 + 0x30) = local_f8.ptr.field_1._48_1_;
          if (local_f8.ptr.field_1._48_1_ == '\x01') {
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x58) = local_f8.ptr.field_1._88_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x60) = local_f8.ptr.field_1._96_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x48) = local_f8.ptr.field_1._72_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x50) = local_f8.ptr.field_1._80_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x38) = local_f8.ptr.field_1._56_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x40) = local_f8.ptr.field_1._64_8_;
          }
        }
        (pMVar1->ptr).isSet = true;
      }
    }
  }
  bVar2 = (this->target).ptr.isSet;
  (__return_storage_ptr__->ptr).isSet = bVar2;
  if (bVar2 == true) {
    uVar4 = (this->target).ptr.field_1.value.tag;
    (__return_storage_ptr__->ptr).field_1.value.tag = uVar4;
    if (uVar4 == 2) {
      uVar6 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 8);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar6;
    }
    else if (uVar4 == 1) {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x28);
      uVar6 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 8);
      uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10);
      uVar8 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x20);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x18);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = uVar8;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uVar6;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar7;
      cVar3 = *(char *)((long)&(this->target).ptr.field_1 + 0x30);
      *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = cVar3;
      if (cVar3 == '\x01') {
        uVar6 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x38);
        uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x40);
        uVar8 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x48);
        uVar9 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x50);
        uVar10 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x60);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
             *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x58);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uVar10;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uVar8;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uVar9;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uVar6;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uVar7;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult> Compiler::Alias::compile() {
  if (!initialized) {
    initialized = true;

    auto& workspace = module.getCompiler().getWorkspace();
    brandOrphan = workspace.orphanage.newOrphan<schema::Brand>();

    // If the Workspace is destroyed, revert the alias to the uninitialized state, because the
    // orphan we created is no longer valid in this case.
    workspace.arena.copy(kj::defer([this]() {
      initialized = false;
      brandOrphan = Orphan<schema::Brand>();
    }));

    target = NodeTranslator::compileDecl(
        parent.getId(), parent.getParameterCount(), parent,
        module.getErrorReporter(), targetName, brandOrphan.get());
  }

  return target;
}